

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O0

void __thiscall GameTitle::drawBorder(GameTitle *this,Screen *screen,int color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined1 local_208 [64];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [39];
  byte local_e1;
  string local_e0 [7];
  bool lineFinished;
  string local_c0 [36];
  int local_9c;
  int local_98;
  int borderCursor [2];
  int borderStartLocation [2];
  int borderWidth;
  int borderHeight;
  int textStartLocation [2];
  string startMessage;
  allocator local_41;
  string local_40 [8];
  string character;
  int color_local;
  Screen *screen_local;
  GameTitle *this_local;
  
  Screen::clearScreen(screen);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40," ",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(textStartLocation + 1),"<Press Enter to Start Game>",
             (allocator *)((long)textStartLocation + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)textStartLocation + 3));
  iVar1 = Screen::getScreenSizeY(screen);
  iVar1 = iVar1 / 2;
  iVar2 = Screen::getScreenSizeX(screen);
  uVar4 = std::__cxx11::string::length();
  iVar2 = iVar2 / 2 - ((int)((int)uVar4 + ((uint)(uVar4 >> 0x1f) & 1)) >> 1);
  iVar3 = std::__cxx11::string::length();
  local_9c = iVar1 + -1;
  local_98 = iVar2 + -1;
  borderCursor[0] = local_9c;
  borderCursor[1] = local_98;
  std::__cxx11::string::string(local_c0,(string *)&this->title);
  Screen::printString(screen,(string *)local_c0,iVar1,iVar2);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::string(local_e0,local_40);
  Screen::printString(screen,(string *)local_e0,borderCursor[0],borderCursor[1]);
  std::__cxx11::string::~string(local_e0);
  Screen::refreshScreen(screen);
  usleep(0x5161);
  local_98 = local_98 + 1;
  local_e1 = 0;
  while (((local_e1 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::string(local_108,local_40);
    Screen::printString(screen,(string *)local_108,local_9c,local_98);
    std::__cxx11::string::~string(local_108);
    Screen::refreshScreen(screen);
    usleep(0x5161);
    local_98 = local_98 + 1;
    if (local_98 == borderCursor[1] + iVar3 + 1) {
      local_e1 = 1;
    }
  }
  local_e1 = 0;
  while (((local_e1 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::string(local_128,(string *)&this->title);
    Screen::printString(screen,(string *)local_128,iVar1,iVar2);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::string(local_148,local_40);
    Screen::printString(screen,(string *)local_148,local_9c,local_98);
    std::__cxx11::string::~string(local_148);
    Screen::refreshScreen(screen);
    usleep(0x5161);
    local_9c = local_9c + 1;
    if (local_9c == borderCursor[0] + 2) {
      local_e1 = 1;
    }
  }
  local_e1 = 0;
  while (((local_e1 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::string(local_168,(string *)&this->title);
    Screen::printString(screen,(string *)local_168,iVar1,iVar2);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::string(local_188,local_40);
    Screen::printString(screen,(string *)local_188,local_9c,local_98);
    std::__cxx11::string::~string(local_188);
    Screen::refreshScreen(screen);
    usleep(0x5161);
    local_98 = local_98 + -1;
    if (local_98 == borderCursor[1]) {
      local_e1 = 1;
    }
  }
  local_e1 = 0;
  while (((local_e1 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::string(local_1a8,(string *)&this->title);
    Screen::printString(screen,(string *)local_1a8,iVar1,iVar2);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::string(local_1c8,local_40);
    Screen::printString(screen,(string *)local_1c8,local_9c,local_98);
    std::__cxx11::string::~string(local_1c8);
    Screen::refreshScreen(screen);
    usleep(0x5161);
    local_9c = local_9c + -1;
    if (local_9c == borderCursor[0]) {
      local_e1 = 1;
    }
  }
  std::__cxx11::string::string((string *)(local_208 + 0x20),(string *)(textStartLocation + 1));
  Screen::printString(screen,(string *)(local_208 + 0x20),iVar1 + 4,iVar2);
  std::__cxx11::string::~string((string *)(local_208 + 0x20));
  Screen::refreshScreen(screen);
  Screen::getInput_abi_cxx11_((Screen *)local_208);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)(textStartLocation + 1));
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void GameTitle::drawBorder(Screen &screen, int color) {
    screen.clearScreen();
    std::string character = " ";
    std::string startMessage = "<Press Enter to Start Game>";

    // Calculate the text location
    int textStartLocation[2];
    textStartLocation[0] = screen.getScreenSizeY() / 2;
    textStartLocation[1] = (screen.getScreenSizeX() / 2) - (static_cast<int>(title.length()) / 2);

    // Calculate the border dimensions
    int borderHeight = 2;
    int borderWidth = static_cast<int>(title.length()) + 1;

    int borderStartLocation[2];
    int borderCursor[2];

    borderStartLocation[0] = borderCursor[0] = textStartLocation[0] - 1;
    borderStartLocation[1] = borderCursor[1] = textStartLocation[1] - 1;

    // Draw the border
    screen.printString(title, textStartLocation[0], textStartLocation[1]);
    screen.printString(character, borderStartLocation[0], borderStartLocation[1]);
    screen.refreshScreen();
    usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

    borderCursor[1]++;

    bool lineFinished = false;

    while(!lineFinished){
        // Print the border
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[1]++;

        if(borderCursor[1] == (borderStartLocation[1] + borderWidth)){
            lineFinished = true;
        }
    }

    lineFinished = false;
    while(!lineFinished){
        // Print the border
        screen.printString(title, textStartLocation[0], textStartLocation[1]);
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[0]++;

        if(borderCursor[0] == (borderStartLocation[0] + borderHeight)){
            lineFinished = true;
        }
    }

    lineFinished = false;
    while(!lineFinished){
        // Print the border
        screen.printString(title, textStartLocation[0], textStartLocation[1]);
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[1]--;

        if(borderCursor[1] == borderStartLocation[1]){
            lineFinished = true;
        }
    }

    lineFinished = false;
    while(!lineFinished){
        // Print the border
        screen.printString(title, textStartLocation[0], textStartLocation[1]);
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[0]--;

        if(borderCursor[0] == borderStartLocation[0]){
            lineFinished = true;
        }
    }

    screen.printString(startMessage, textStartLocation[0] + 4, textStartLocation[1]);
    screen.refreshScreen();

    screen.getInput();
}